

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O3

void __thiscall crnlib::mipmapped_texture::assign(mipmapped_texture *this,face_vec *faces)

{
  uint uVar1;
  vector<crnlib::mip_level_*> *pvVar2;
  mip_level *pmVar3;
  vector<crnlib::mip_level_*> *pvVar4;
  component_flags cVar5;
  pixel_format pVar6;
  
  if (faces->m_size != 0) {
    free_all_mips(this);
    pvVar2 = faces->m_p;
    pmVar3 = *pvVar2->m_p;
    uVar1 = pmVar3->m_height;
    cVar5 = pmVar3->m_comp_flags;
    pVar6 = pmVar3->m_format;
    this->m_width = pmVar3->m_width;
    this->m_height = uVar1;
    this->m_comp_flags = cVar5;
    this->m_format = pVar6;
    pvVar4 = (this->m_faces).m_p;
    (this->m_faces).m_p = pvVar2;
    faces->m_p = pvVar4;
    uVar1 = (this->m_faces).m_size;
    (this->m_faces).m_size = faces->m_size;
    faces->m_size = uVar1;
    uVar1 = (this->m_faces).m_capacity;
    (this->m_faces).m_capacity = faces->m_capacity;
    faces->m_capacity = uVar1;
  }
  return;
}

Assistant:

inline bool empty() const
        {
            return !m_size;
        }